

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.hpp
# Opt level: O3

string * format_string<unsigned_long,int,unsigned_long>
                   (string *__return_storage_ptr__,string *format,unsigned_long args,int args_1,
                   unsigned_long args_2)

{
  ulong __maxlen;
  uint uVar1;
  char *__s;
  runtime_error *this;
  
  uVar1 = snprintf((char *)0x0,0,(format->_M_dataplus)._M_p);
  if (-1 < (int)uVar1) {
    __maxlen = (ulong)uVar1 + 1;
    __s = (char *)operator_new__(__maxlen);
    snprintf(__s,__maxlen,(format->_M_dataplus)._M_p,args,(ulong)(uint)args_1,args_2);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s,__s + uVar1);
    operator_delete__(__s);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Error during formatting.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string format_string(const std::string &format, Args ... args) {
  int size = snprintf(nullptr, 0, format.c_str(), args ...) + 1; // Extra space for '\0'
  if (size <= 0) { throw std::runtime_error("Error during formatting."); }
  std::unique_ptr<char[]> buf(new char[size]);
  snprintf(buf.get(), static_cast<size_t>(size), format.c_str(), args ...);
  return std::string(buf.get(), buf.get() + size - 1); // We don't want the '\0' inside
}